

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void gen_block(_node_t *node)

{
  int *piVar1;
  long in_RDI;
  _node_t *child;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  
  syms_set_cur_scope(0);
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 8); uVar2 = uVar2 + 1) {
    piVar1 = *(int **)(*(long *)(in_RDI + 0x18) + (ulong)uVar2 * 8);
    if (piVar1[1] == 1) {
      gen_block((_node_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
    }
    else if (piVar1[1] == 2) {
      fprintf((FILE *)f,"; FUNCTION\n");
      fprintf((FILE *)f,"%s:\n",piVar1 + 9);
    }
    else if (piVar1[1] == 5) {
      gen_assign((_node_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
    }
    else if ((((*piVar1 == 0x87) || (*piVar1 == 0x86)) || (piVar1[1] == 3)) || (piVar1[1] == 4)) {
      gen_expr((_node_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
      fprintf((FILE *)f,"        call print_a   ; DEBUG\n");
    }
    else if (*piVar1 == 0x83) {
      gen_jump((_node_t *)0x102d84);
    }
    else {
      ccerr(F,"unhandled node");
    }
  }
  syms_dec_scope();
  return;
}

Assistant:

void gen_block(_node_t* node)
{
    unsigned int i;
    _node_t* child;

    syms_set_cur_scope(node->num_value);

    for (i = 0; i < node->num_children; i++)
    {
        child = node->children[i];
        if (child->type == STATEMENT_LIST)
        {
            gen_block(child);
        }
        else if (child->type == FUNCTION)
        {
            fprintf(f, "; FUNCTION\n");
            fprintf(f, "%s:\n", child->identifier);
        }
        else if (child->type == ASSIGN)
        {
            gen_assign(child);
        }
        else if (child->id == CONSTANT || child->id == IDENTIFIER ||
                 child->type == BINOP || child->type == UNOP)
        {
            gen_expr(child);
            fprintf(f, "        call print_a   ; DEBUG\n");
        }
        else if (child->id == RETURN)
        {
            gen_jump(child);
        }
        else
        {
            ccerr(F, "unhandled node");
        }
    }

    syms_dec_scope();
}